

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

void helicsAppLoadFile(HelicsApp app,char *configFile,HelicsError *err)

{
  App *this;
  allocator<char> local_39;
  string local_38;
  
  this = getApp(app,err);
  if (this != (App *)0x0) {
    if (configFile == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_38,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,configFile,&local_39);
    }
    helics::apps::App::loadFile(this,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void helicsAppLoadFile(HelicsApp app, const char* configFile, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->loadFile(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}